

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_pdu.cc
# Opt level: O0

ssize_t __thiscall
assembler::TransportPDU::read(TransportPDU *this,int __fd,void *__buf,size_t __nbytes)

{
  uint16_t uVar1;
  size_type sVar2;
  unsigned_long *puVar3;
  reference pvVar4;
  TransportPDU *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  undefined4 in_register_00000034;
  unsigned_long dread;
  size_type dpos;
  size_type remaining_1;
  unsigned_long hread;
  size_type hpos;
  size_type remaining;
  size_t nread;
  unsigned_long local_60;
  size_type in_stack_ffffffffffffffa8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb0;
  unsigned_long local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  size_type local_30;
  unsigned_long local_28;
  void *local_20;
  void *local_18;
  long local_10;
  TransportPDU *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_20 = (void *)0x0;
  local_18 = __buf;
  local_8 = this;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->header);
  if (sVar2 < 6) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->header);
    local_28 = 6 - sVar2;
    local_30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->header);
    local_40 = (long)local_18 - (long)local_20;
    puVar3 = std::min<unsigned_long>(&local_28,&local_40);
    local_38 = *puVar3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->header,local_30);
    memcpy(pvVar4,(void *)(local_10 + (long)local_20),local_38);
    local_20 = (void *)(local_38 + (long)local_20);
  }
  if (local_20 < local_18) {
    this_00 = (TransportPDU *)
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
    uVar1 = length(this_00);
    if (this_00 < (TransportPDU *)(ulong)uVar1) {
      uVar1 = length(this_00);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
      local_48 = uVar1 - sVar2;
      this_01 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
      local_60 = (long)local_18 - (long)local_20;
      puVar3 = std::min<unsigned_long>(&local_48,&local_60);
      sVar2 = *puVar3;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_01,sVar2);
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->data,(size_type)this_01);
      memcpy(pvVar4,(void *)(local_10 + (long)local_20),sVar2);
      local_20 = (void *)(sVar2 + (long)local_20);
    }
  }
  return (ssize_t)local_20;
}

Assistant:

size_t TransportPDU::read(const uint8_t* buf, size_t len) {
  size_t nread = 0;

  // Read remaining header
  if (header.size() < headerBytes) {
    auto remaining = headerBytes - header.size();
    auto hpos = header.size();
    auto hread = std::min(remaining, (len-nread));
    header.resize(hpos + hread);
    memcpy(&header[hpos], &buf[nread], hread);
    nread += hread;
  }

  // Read remaining user data (if there is more data)
  if (nread < len) {
    if (data.size() < length()) {
      auto remaining = length() - data.size();
      auto dpos = data.size();
      auto dread = std::min(remaining, (len-nread));
      data.resize(dpos + dread);
      memcpy(&data[dpos], &buf[nread], dread);
      nread += dread;
    }
  }

  return nread;
}